

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftutil.c
# Opt level: O1

FT_Error FT_List_Iterate(FT_List list,FT_List_Iterator iterator,void *user)

{
  FT_ListNode pFVar1;
  FT_Error FVar2;
  FT_ListNode pFVar3;
  
  FVar2 = 6;
  if (iterator != (FT_List_Iterator)0x0 && list != (FT_List)0x0) {
    pFVar3 = list->head;
    if (pFVar3 == (FT_ListNode)0x0) {
      FVar2 = 0;
    }
    else {
      do {
        pFVar1 = pFVar3->next;
        FVar2 = (*iterator)(pFVar3,user);
        if (FVar2 != 0) {
          return FVar2;
        }
        FVar2 = 0;
        pFVar3 = pFVar1;
      } while (pFVar1 != (FT_ListNode)0x0);
    }
  }
  return FVar2;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_List_Iterate( FT_List           list,
                   FT_List_Iterator  iterator,
                   void*             user )
  {
    FT_ListNode  cur;
    FT_Error     error = FT_Err_Ok;


    if ( !list || !iterator )
      return FT_THROW( Invalid_Argument );

    cur = list->head;

    while ( cur )
    {
      FT_ListNode  next = cur->next;


      error = iterator( cur, user );
      if ( error )
        break;

      cur = next;
    }

    return error;
  }